

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O1

QList<QSize> * __thiscall
QIconLoaderEngine::availableSizes
          (QList<QSize> *__return_storage_ptr__,QIconLoaderEngine *this,Mode mode,State state)

{
  qsizetype *pqVar1;
  pointer puVar2;
  QIconLoaderEngineEntry *pQVar3;
  QSize *pQVar4;
  int *piVar5;
  QSize *pQVar6;
  pointer puVar7;
  long in_FS_OFFSET;
  QIcon local_50;
  QSize local_48;
  QSize *local_40;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  puVar7 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QSize *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QSize>::reserve(__return_storage_ptr__,(long)puVar7 - (long)puVar2 >> 3);
  puVar7 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_info).entries.
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar2) {
    do {
      pQVar3 = (puVar7->_M_t).
               super___uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
               ._M_t.
               super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
               .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl;
      if ((pQVar3->dir).type == Fallback) {
        QIcon::QIcon(&local_50,
                     &((puVar7->_M_t).
                       super___uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
                       .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl)->
                      filename);
        QIcon::availableSizes((QList<QSize> *)&local_48,&local_50,Normal,Off);
        if (local_38 != 0) {
          if (((int *)CONCAT44(local_48.ht.m_i,local_48.wd.m_i) == (int *)0x0) ||
             (1 < *(int *)CONCAT44(local_48.ht.m_i,local_48.wd.m_i))) {
            QtPrivate::QCommonArrayOps<QSize>::growAppend
                      ((QCommonArrayOps<QSize> *)__return_storage_ptr__,local_40,local_40 + local_38
                      );
          }
          else {
            QArrayDataPointer<QSize>::detachAndGrow
                      (&__return_storage_ptr__->d,GrowsAtEnd,local_38,(QSize **)0x0,
                       (QArrayDataPointer<QSize> *)0x0);
            if ((local_38 != 0) && (0 < local_38)) {
              pQVar4 = (__return_storage_ptr__->d).ptr;
              pQVar6 = local_40;
              do {
                pQVar4[(__return_storage_ptr__->d).size] = *pQVar6;
                pQVar6 = pQVar6 + 1;
                pqVar1 = &(__return_storage_ptr__->d).size;
                *pqVar1 = *pqVar1 + 1;
              } while (pQVar6 < local_40 + local_38);
            }
          }
        }
        piVar5 = (int *)CONCAT44(local_48.ht.m_i,local_48.wd.m_i);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            QArrayData::deallocate((QArrayData *)CONCAT44(local_48.ht.m_i,local_48.wd.m_i),8,0x10);
          }
        }
        QIcon::~QIcon(&local_50);
      }
      else {
        local_48.wd.m_i = (int)(pQVar3->dir).size;
        local_48.ht.m_i = local_48.wd.m_i;
        QtPrivate::QMovableArrayOps<QSize>::emplace<QSize>
                  ((QMovableArrayOps<QSize> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_48);
        QList<QSize>::end(__return_storage_ptr__);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QSize> QIconLoaderEngine::availableSizes(QIcon::Mode mode, QIcon::State state)
{
    Q_UNUSED(mode);
    Q_UNUSED(state);

    const qsizetype N = qsizetype(m_info.entries.size());
    QList<QSize> sizes;
    sizes.reserve(N);

    // Gets all sizes from the DirectoryInfo entries
    for (const auto &entry : m_info.entries) {
        if (entry->dir.type == QIconDirInfo::Fallback) {
            sizes.append(QIcon(entry->filename).availableSizes());
        } else {
            int size = entry->dir.size;
            sizes.append(QSize(size, size));
        }
    }
    return sizes;
}